

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cipher.cc
# Opt level: O3

int SSL_CIPHER_get_digest_nid(SSL_CIPHER *cipher)

{
  uint32_t uVar1;
  
  uVar1 = cipher->algorithm_mac;
  if (uVar1 == 4) {
    return 0;
  }
  if (uVar1 != 2) {
    if (uVar1 == 1) {
      return 0x40;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cipher.cc"
                  ,0x52a,"int SSL_CIPHER_get_digest_nid(const SSL_CIPHER *)");
  }
  return 0x2a0;
}

Assistant:

int SSL_CIPHER_get_digest_nid(const SSL_CIPHER *cipher) {
  switch (cipher->algorithm_mac) {
    case SSL_AEAD:
      return NID_undef;
    case SSL_SHA1:
      return NID_sha1;
    case SSL_SHA256:
      return NID_sha256;
  }
  assert(0);
  return NID_undef;
}